

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

SASL_RESPONSE_HANDLE sasl_response_create(amqp_binary response_value)

{
  int iVar1;
  SASL_RESPONSE_HANDLE sasl_response;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  amqp_binary value_00;
  
  value_00.bytes = response_value.bytes;
  sasl_response = (SASL_RESPONSE_HANDLE)malloc(8);
  if (sasl_response != (SASL_RESPONSE_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x43);
    sasl_response->composite_value = value;
    if (value == (AMQP_VALUE)0x0) {
      free(sasl_response);
    }
    else {
      value_00._8_8_ = response_value._8_8_ & 0xffffffff;
      item_value = amqpvalue_create_binary(value_00);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return sasl_response;
      }
      sasl_response_destroy(sasl_response);
    }
  }
  return (SASL_RESPONSE_HANDLE)0x0;
}

Assistant:

SASL_RESPONSE_HANDLE sasl_response_create(amqp_binary response_value)
{
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)malloc(sizeof(SASL_RESPONSE_INSTANCE));
    if (sasl_response_instance != NULL)
    {
        sasl_response_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(67);
        if (sasl_response_instance->composite_value == NULL)
        {
            free(sasl_response_instance);
            sasl_response_instance = NULL;
        }
        else
        {
            AMQP_VALUE response_amqp_value;
            int result = 0;

            response_amqp_value = amqpvalue_create_binary(response_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_response_instance->composite_value, 0, response_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(response_amqp_value);
            if (result != 0)
            {
                sasl_response_destroy(sasl_response_instance);
                sasl_response_instance = NULL;
            }
        }
    }

    return sasl_response_instance;
}